

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.cpp
# Opt level: O2

bool __thiscall pgn::parse_files(pgn *this)

{
  pointer pbVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  istream *piVar5;
  pointer pbVar6;
  bool bStack_24e49;
  game g;
  string line;
  istringstream tmp;
  istringstream fen;
  ifstream pgn_file;
  position p;
  
  pbVar6 = (this->pgn_files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->pgn_files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar6 == pbVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"..parsed ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," chess games.");
      std::endl<char,std::char_traits<char>>(poVar4);
      return true;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"..parsing games from ");
    poVar4 = std::operator<<(poVar4,(string *)pbVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ifstream::ifstream((istream *)&pgn_file,(pbVar6->_M_dataplus)._M_p,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cout,"..failed to open pgn file, skipping");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      game::game(&g);
      position::position(&p);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&fen,(string *)&START_FEN_abi_cxx11_,_S_in);
      position::setup(&p,&fen);
      bStack_24e49 = true;
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&pgn_file,(string *)&line);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        bVar3 = is_empty(this,&line);
        if (bVar3) {
LAB_00119cb6:
          bVar3 = is_elo(this,&line);
          if (bVar3) {
            parse_elo(this,&g,&line);
          }
        }
        else {
          bVar3 = is_header(this,&line);
          if (bVar3) goto LAB_00119cb6;
          bVar3 = parse_moves(this,&p,&line,&g);
          if (bVar3) {
            if (g.result != pgn_none) {
              if (bStack_24e49 != false) {
                std::vector<game,_std::allocator<game>_>::push_back(&this->games,&g);
              }
              if (g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     g.moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                     super__Vector_impl_data._M_start;
              }
              g.result = pgn_none;
              g.white_elo = 0;
              g.black_elo = 0;
              position::clear(&p);
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)&tmp,(string *)&START_FEN_abi_cxx11_,_S_in);
              position::setup(&p,&tmp);
              std::__cxx11::istringstream::~istringstream((istringstream *)&tmp);
              bStack_24e49 = bVar3;
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,"..error parsing line: ");
            poVar4 = std::operator<<(poVar4,(string *)&line);
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)&std::cout,"..from file ");
            poVar4 = std::operator<<(poVar4,(string *)pbVar6);
            std::endl<char,std::char_traits<char>>(poVar4);
            bStack_24e49 = bVar3;
          }
        }
      }
      std::ifstream::close();
      std::__cxx11::istringstream::~istringstream((istringstream *)&fen);
      position::~position(&p);
      std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
                (&g.moves.super__Vector_base<Move,_std::allocator<Move>_>);
      std::__cxx11::string::~string((string *)&line);
    }
    std::ifstream::~ifstream((istream *)&pgn_file);
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

bool pgn::parse_files() {

	size_t fcount = 0;
	for (const auto& f : pgn_files) {

		std::cout << "..parsing games from " << f << std::endl;

		std::ifstream pgn_file(f.c_str(), std::fstream::in);


		if (!pgn_file.is_open()) {
			std::cout << "..failed to open pgn file, skipping" << std::endl;
			continue;
		}

		std::string line;
		game g;

		position p;
		std::istringstream fen(START_FEN);
		p.setup(fen); // start position for each game
		bool success = true;

		while (std::getline(pgn_file, line)) {

			if (is_empty(line) || is_header(line)) {
				if (is_elo(line)) parse_elo(g, line);
				continue;
			}

			if (!parse_moves(p, line, g)) {
				std::cout << "..error parsing line: " << line << std::endl;
				std::cout << "..from file " << f << std::endl;
				success = false;
				continue;
			}

			if (g.finished()) {
				if (success) games.push_back(g);
				g.clear();
				p.clear();
				std::istringstream tmp(START_FEN);
				p.setup(tmp);
				success = true;
			}
		}

		++fcount;
		pgn_file.close();

	}
	std::cout << "..parsed " << games.size() << " chess games." << std::endl;

	return true;
}